

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

double __thiscall
despot::RockSampleParticleUpperBound2::Value(RockSampleParticleUpperBound2 *this,State *state)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  BaseRockSample *pBVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double local_30;
  
  pBVar4 = this->rs_model_;
  uVar3 = (ulong)(uint)pBVar4->num_rocks_;
  if (pBVar4->num_rocks_ < 1) {
    local_30 = 0.0;
  }
  else {
    local_30 = 0.0;
    lVar5 = 0;
    do {
      dVar6 = 10.0;
      if ((*(uint *)(state + 0xc) >> ((uint)lVar5 & 0x1f) & 1) == 0) {
        dVar6 = 0.0;
      }
      uVar2 = Grid<int>::GetCoord(&pBVar4->grid_,(int)*(uint *)(state + 0xc) >> ((byte)uVar3 & 0x1f)
                                 );
      iVar1 = despot::Coord::ManhattanDistance
                        (uVar2,*(undefined8 *)
                                ((this->rs_model_->rock_pos_).
                                 super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar5 * 8));
      dVar7 = pow(_ParticleBelief,(double)iVar1);
      local_30 = local_30 + dVar7 * dVar6;
      lVar5 = lVar5 + 1;
      pBVar4 = this->rs_model_;
      uVar3 = (ulong)pBVar4->num_rocks_;
    } while (lVar5 < (long)uVar3);
  }
  dVar6 = pow(_ParticleBelief,
              (double)(pBVar4->size_ -
                      (*(int *)(state + 0xc) >> ((byte)uVar3 & 0x1f)) % (pBVar4->grid_).xsize_));
  return dVar6 * 10.0 + local_30;
}

Assistant:

double Value(const State& state) const {
		const RockSampleState& rockstate =
			static_cast<const RockSampleState&>(state);
		double value = 0;
		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			value += 10.0 * rs_model_->GetRock(&rockstate, rock)
				* Globals::Discount(
					Coord::ManhattanDistance(rs_model_->GetRobPos(&rockstate),
						rs_model_->rock_pos_[rock]));
		value += 10.0
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&rockstate));
		return value;
	}